

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void init_test(void)

{
  size_t *psVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_config *__ptr;
  size_t metalen;
  size_t bodylen;
  fdb_kvs_handle *fconfig_00;
  fdb_config *pfVar5;
  uint uVar6;
  ulong unaff_RBP;
  char *pcVar7;
  fdb_file_info *unaff_R12;
  fdb_file_handle **ptr_fhandle;
  ulong uVar8;
  fdb_kvs_handle *unaff_R13;
  fdb_kvs_handle **unaff_R15;
  char *kvs_config_00;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  fdb_doc *pfStack_118e0;
  fdb_kvs_handle *pfStack_118d8;
  fdb_file_handle *pfStack_118d0;
  timeval tStack_118c8;
  fdb_kvs_config fStack_118b8;
  fdb_config fStack_118a0;
  char acStack_117a8 [256];
  char *pcStack_116a8;
  fdb_config *pfStack_116a0;
  fdb_config *pfStack_11698;
  fdb_file_handle *pfStack_11688;
  fdb_kvs_handle *pfStack_11680;
  fdb_kvs_config fStack_11678;
  timeval tStack_11660;
  char acStack_11650 [264];
  fdb_config fStack_11548;
  char acStack_11450 [256];
  char acStack_11350 [264];
  char *pcStack_11248;
  fdb_file_handle **ppfStack_11240;
  fdb_kvs_handle *pfStack_11238;
  fdb_config *pfStack_11230;
  fdb_kvs_config *pfStack_11228;
  code *pcStack_11220;
  fdb_kvs_handle *pfStack_11208;
  fdb_file_handle *pfStack_11200;
  fdb_iterator *pfStack_111f8;
  timeval tStack_111f0;
  fdb_kvs_config fStack_111e0;
  fdb_file_handle *apfStack_111c8 [32];
  fdb_config fStack_110c8;
  fdb_config fStack_10fc0;
  char acStack_10ec8 [264];
  fdb_config *pfStack_10dc0;
  fdb_file_info *pfStack_10db8;
  fdb_kvs_handle *pfStack_10db0;
  fdb_config *pfStack_10da8;
  fdb_kvs_handle **ppfStack_10da0;
  code *pcStack_10d98;
  fdb_file_handle *pfStack_10d88;
  fdb_kvs_handle *pfStack_10d80;
  fdb_doc *pfStack_10d78;
  undefined1 auStack_10d70 [40];
  fdb_seqnum_t fStack_10d48;
  uint64_t uStack_10d40;
  void *pvStack_10d38;
  fdb_config *pfStack_10d30;
  uint64_t uStack_10d28;
  fdb_kvs_config fStack_10d20;
  timeval tStack_10d08;
  undefined1 auStack_10cf8 [72];
  fdb_config fStack_10cb0;
  char acStack_10bb0 [256];
  fdb_config fStack_10ab0;
  fdb_config *pfStack_109b8;
  fdb_config *pfStack_109b0;
  fdb_doc *pfStack_109a0;
  fdb_kvs_handle *pfStack_10998;
  fdb_file_handle *pfStack_10990;
  undefined1 auStack_10988 [40];
  fdb_seqnum_t fStack_10960;
  uint64_t uStack_10958;
  void *pvStack_10950;
  fdb_config *pfStack_10948;
  uint64_t uStack_10940;
  fdb_kvs_config fStack_10930;
  timeval tStack_10918;
  uint8_t auStack_10908 [256];
  fdb_config fStack_10808;
  fdb_config fStack_10708;
  fdb_config *pfStack_10610;
  fdb_config *pfStack_10608;
  fdb_file_handle *pfStack_105f8;
  fdb_kvs_handle *pfStack_105f0;
  size_t sStack_105e8;
  int *piStack_105e0;
  timeval tStack_105d8;
  fdb_config fStack_105c8;
  fdb_kvs_handle *pfStack_104d0;
  fdb_file_handle *pfStack_104c0;
  fdb_kvs_handle *pfStack_104b8;
  fdb_kvs_config fStack_104b0;
  timeval tStack_10498;
  fdb_config fStack_10488;
  fdb_file_info fStack_10390;
  char acStack_10348 [264];
  fdb_kvs_handle *pfStack_10240;
  fdb_kvs_handle *pfStack_10210;
  fdb_file_handle *pfStack_10208;
  size_t sStack_10200;
  void *pvStack_101f8;
  fdb_kvs_config fStack_101f0;
  timeval tStack_101d8;
  fdb_kvs_handle afStack_101c8 [126];
  undefined1 uStack_151;
  fdb_config *pfStack_148;
  fdb_file_handle *local_138;
  fdb_kvs_handle *local_130;
  fdb_kvs_config local_128;
  timeval local_110;
  fdb_config local_100;
  
  gettimeofday(&local_110,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  system("rm -rf  dummy* > errorlog.txt");
  fVar2 = fdb_init(&local_100);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_open(&local_138,"./dummy1",&local_100);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010feac;
    fVar2 = fdb_kvs_open_default(local_138,&local_130,&local_128);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010feb1;
    fVar2 = fdb_close(local_138);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010feb6;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (init_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar7,"init test");
      return;
    }
  }
  else {
    init_test();
LAB_0010feac:
    init_test();
LAB_0010feb1:
    init_test();
LAB_0010feb6:
    init_test();
  }
  init_test();
  pfStack_148 = &local_100;
  gettimeofday(&tStack_101d8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fconfig_00 = afStack_101c8;
  fdb_get_default_config();
  afStack_101c8[0].kvs_config.create_if_missing = true;
  afStack_101c8[0].kvs_config._1_1_ = 0;
  system("rm -rf  dummy* > errorlog.txt");
  memset(&afStack_101c8[0].config.num_bgflusher_threads,0x61,0xff80);
  uStack_151 = 0;
  fVar2 = fdb_open(&pfStack_10208,"./dummy1",(fdb_config *)fconfig_00);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_kvs_open_default(pfStack_10208,&pfStack_10210,&fStack_101f0);
    handle = pfStack_10210;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110023;
    psVar1 = &afStack_101c8[0].config.num_bgflusher_threads;
    sVar3 = strlen((char *)psVar1);
    fVar2 = fdb_set_kv(handle,psVar1,sVar3,(void *)0x0,0);
    fconfig_00 = handle;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110028;
    fVar2 = fdb_get(pfStack_10210,(fdb_doc *)0x0);
    if (fVar2 != FDB_RESULT_INVALID_ARGS) goto LAB_0011002d;
    psVar1 = &afStack_101c8[0].config.num_bgflusher_threads;
    sVar3 = strlen((char *)psVar1);
    fVar2 = fdb_get_kv(pfStack_10210,psVar1,sVar3,&pvStack_101f8,&sStack_10200);
    fconfig_00 = pfStack_10210;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_close(pfStack_10208);
      fdb_shutdown();
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (set_get_max_keylen()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar7,"set get max keylen");
      return;
    }
  }
  else {
    set_get_max_keylen();
LAB_00110023:
    set_get_max_keylen();
LAB_00110028:
    set_get_max_keylen();
LAB_0011002d:
    set_get_max_keylen();
  }
  pcVar7 = (char *)&afStack_101c8[0].config.num_bgflusher_threads;
  set_get_max_keylen();
  pfStack_104d0 = (fdb_kvs_handle *)0x110054;
  pfStack_10240 = fconfig_00;
  gettimeofday(&tStack_10498,(__timezone_ptr_t)0x0);
  pfStack_104d0 = (fdb_kvs_handle *)0x110059;
  memleak_start();
  pfStack_104d0 = (fdb_kvs_handle *)0x110065;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_104d0 = (fdb_kvs_handle *)0x11006a;
  sVar4 = fdb_get_buffer_cache_used();
  if (sVar4 == 0) {
    fconfig_00 = (fdb_kvs_handle *)acStack_10348;
    pfStack_104d0 = (fdb_kvs_handle *)0x110083;
    fdb_get_default_config();
    pcVar7 = (char *)&fStack_10488;
    pfStack_104d0 = (fdb_kvs_handle *)0x110098;
    memcpy(pcVar7,fconfig_00,0xf8);
    fStack_10488.buffercache_size = 0xffffffffffffffff;
    pfStack_104d0 = (fdb_kvs_handle *)0x1100b4;
    fVar2 = fdb_open(&pfStack_104c0,"./dummy1",(fdb_config *)pcVar7);
    if (fVar2 != FDB_RESULT_TOO_BIG_BUFFER_CACHE) goto LAB_0011030f;
    fconfig_00 = (fdb_kvs_handle *)acStack_10348;
    pfStack_104d0 = (fdb_kvs_handle *)0x1100cd;
    fdb_get_default_config();
    pcVar7 = (char *)&fStack_10488;
    pfStack_104d0 = (fdb_kvs_handle *)0x1100e2;
    memcpy(pcVar7,fconfig_00,0xf8);
    fStack_10488.max_writer_lock_prob = 0x78;
    pfStack_104d0 = (fdb_kvs_handle *)0x1100fe;
    fVar2 = fdb_open(&pfStack_104c0,"./dummy1",(fdb_config *)pcVar7);
    if (fVar2 != FDB_RESULT_INVALID_CONFIG) goto LAB_00110314;
    fconfig_00 = (fdb_kvs_handle *)acStack_10348;
    pfStack_104d0 = (fdb_kvs_handle *)0x110117;
    fdb_get_default_config();
    pfStack_104d0 = (fdb_kvs_handle *)0x110129;
    memcpy(&fStack_10488,fconfig_00,0xf8);
    pfStack_104d0 = (fdb_kvs_handle *)0x110133;
    fdb_get_default_kvs_config();
    unaff_RBP = 4;
    pcVar7 = "justonekv";
    unaff_R15 = &pfStack_104b8;
    unaff_R12 = &fStack_10390;
    do {
      pfStack_104d0 = (fdb_kvs_handle *)0x11015f;
      sprintf((char *)fconfig_00,"dummy%d",unaff_RBP);
      pfStack_104d0 = (fdb_kvs_handle *)0x110171;
      fVar2 = fdb_open(&pfStack_104c0,(char *)fconfig_00,&fStack_10488);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_001102fb:
        pfStack_104d0 = (fdb_kvs_handle *)0x110300;
        config_test();
LAB_00110300:
        pfStack_104d0 = (fdb_kvs_handle *)0x110305;
        config_test();
LAB_00110305:
        pfStack_104d0 = (fdb_kvs_handle *)0x11030a;
        config_test();
        goto LAB_0011030a;
      }
      pfStack_104d0 = (fdb_kvs_handle *)0x11018e;
      fVar2 = fdb_kvs_open(pfStack_104c0,unaff_R15,"justonekv",&fStack_104b0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_104d0 = (fdb_kvs_handle *)0x1102fb;
        config_test();
        goto LAB_001102fb;
      }
      pfStack_104d0 = (fdb_kvs_handle *)0x11019b;
      unaff_R13 = (fdb_kvs_handle *)fdb_get_buffer_cache_used();
      pfStack_104d0 = (fdb_kvs_handle *)0x1101ab;
      fVar2 = fdb_get_file_info(pfStack_104c0,unaff_R12);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110305;
      if (fStack_10390.file_size != fStack_10488.blocksize * 7) {
        pfStack_104d0 = (fdb_kvs_handle *)0x110203;
        config_test();
      }
      if (unaff_R13 != (fdb_kvs_handle *)(ulong)(fStack_10488.blocksize * 2)) {
        pfStack_104d0 = (fdb_kvs_handle *)0x110212;
        config_test();
      }
      pfStack_104d0 = (fdb_kvs_handle *)0x1101df;
      fVar2 = fdb_close(pfStack_104c0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110300;
      uVar6 = (int)unaff_RBP - 1;
      unaff_RBP = (ulong)uVar6;
    } while (uVar6 != 0);
    pfStack_104d0 = (fdb_kvs_handle *)0x11022b;
    fVar2 = fdb_open(&pfStack_104c0,acStack_10348,&fStack_10488);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110319;
    pfStack_104d0 = (fdb_kvs_handle *)0x11024e;
    fVar2 = fdb_kvs_open(pfStack_104c0,&pfStack_104b8,"justonekv",&fStack_104b0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011031e;
    pfStack_104d0 = (fdb_kvs_handle *)0x110279;
    fVar2 = fdb_set_kv(pfStack_104b8,"key",3,"body",5);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_104d0 = (fdb_kvs_handle *)0x110286;
      sVar4 = fdb_get_buffer_cache_used();
      if (sVar4 != fStack_10488.blocksize << 3) {
        pfStack_104d0 = (fdb_kvs_handle *)0x11029f;
        config_test();
      }
      pfStack_104d0 = (fdb_kvs_handle *)0x1102a9;
      fdb_close(pfStack_104c0);
      pfStack_104d0 = (fdb_kvs_handle *)0x1102ae;
      fdb_shutdown();
      pfStack_104d0 = (fdb_kvs_handle *)0x1102b3;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (config_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_104d0 = (fdb_kvs_handle *)0x1102e4;
      fprintf(_stderr,pcVar7,"forestdb config test");
      return;
    }
  }
  else {
LAB_0011030a:
    pfStack_104d0 = (fdb_kvs_handle *)0x11030f;
    config_test();
LAB_0011030f:
    pfStack_104d0 = (fdb_kvs_handle *)0x110314;
    config_test();
LAB_00110314:
    pfStack_104d0 = (fdb_kvs_handle *)0x110319;
    config_test();
LAB_00110319:
    pfStack_104d0 = (fdb_kvs_handle *)0x11031e;
    config_test();
LAB_0011031e:
    pfStack_104d0 = (fdb_kvs_handle *)0x110323;
    config_test();
  }
  pfStack_104d0 = (fdb_kvs_handle *)delete_reopen_test;
  config_test();
  pfStack_10608 = (fdb_config *)0x11033c;
  pfStack_104d0 = fconfig_00;
  gettimeofday(&tStack_105d8,(__timezone_ptr_t)0x0);
  pfStack_10608 = (fdb_config *)0x110341;
  memleak_start();
  pfStack_10608 = (fdb_config *)0x11034d;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_10608 = (fdb_config *)0x11035a;
  fdb_get_default_config();
  fStack_105c8.buffercache_size = 0;
  fStack_105c8.num_compactor_threads = 1;
  pfStack_10608 = (fdb_config *)0x11037e;
  fVar2 = fdb_open(&pfStack_105f8,"./dummy3",&fStack_105c8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_10608 = (fdb_config *)0x110397;
    fVar2 = fdb_kvs_open_default(pfStack_105f8,&pfStack_105f0,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011058e;
    pfStack_10608 = (fdb_config *)0x1103ae;
    fVar2 = fdb_begin_transaction(pfStack_105f8,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110593;
    pfStack_10608 = (fdb_config *)0x1103d9;
    fVar2 = fdb_set_kv(pfStack_105f0,"foo",3,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110598;
    pfStack_10608 = (fdb_config *)0x1103ed;
    fVar2 = fdb_end_transaction(pfStack_105f8,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011059d;
    pfStack_10608 = (fdb_config *)0x110415;
    fVar2 = fdb_get_kv(pfStack_105f0,"foo",3,&piStack_105e0,&sStack_105e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105a2;
    if (sStack_105e8 != 5) {
      pfStack_10608 = (fdb_config *)0x11042f;
      delete_reopen_test();
    }
    if ((char)piStack_105e0[1] != 'e' || *piStack_105e0 != 0x756c6176) goto LAB_001105a7;
    pfStack_10608 = (fdb_config *)0x11044f;
    fdb_free_block(piStack_105e0);
    pfStack_10608 = (fdb_config *)0x11045e;
    fVar2 = fdb_begin_transaction(pfStack_105f8,'\x02');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105ac;
    pfStack_10608 = (fdb_config *)0x11047c;
    fVar2 = fdb_del_kv(pfStack_105f0,"foo",3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105b1;
    pfStack_10608 = (fdb_config *)0x110490;
    fVar2 = fdb_end_transaction(pfStack_105f8,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105b6;
    pfStack_10608 = (fdb_config *)0x1104b8;
    fVar2 = fdb_get_kv(pfStack_105f0,"foo",3,&piStack_105e0,&sStack_105e8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105bb;
    pfStack_10608 = (fdb_config *)0x1104cb;
    fVar2 = fdb_close(pfStack_105f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105c0;
    pfStack_10608 = (fdb_config *)0x1104e9;
    fVar2 = fdb_open(&pfStack_105f8,"./dummy3",&fStack_105c8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105c5;
    pfStack_10608 = (fdb_config *)0x110502;
    fVar2 = fdb_kvs_open_default(pfStack_105f8,&pfStack_105f0,(fdb_kvs_config *)0x0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001105ca;
    pfStack_10608 = (fdb_config *)0x11052a;
    fVar2 = fdb_get_kv(pfStack_105f0,"foo",3,&piStack_105e0,&sStack_105e8);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001105cf;
    pfStack_10608 = (fdb_config *)0x11053d;
    fVar2 = fdb_close(pfStack_105f8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_10608 = (fdb_config *)0x11054a;
      fdb_shutdown();
      pfStack_10608 = (fdb_config *)0x11054f;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (delete_reopen_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_10608 = (fdb_config *)0x110580;
      fprintf(_stderr,pcVar7,"end trans delete & reopen passed");
      return;
    }
  }
  else {
    pfStack_10608 = (fdb_config *)0x11058e;
    delete_reopen_test();
LAB_0011058e:
    pfStack_10608 = (fdb_config *)0x110593;
    delete_reopen_test();
LAB_00110593:
    pfStack_10608 = (fdb_config *)0x110598;
    delete_reopen_test();
LAB_00110598:
    pfStack_10608 = (fdb_config *)0x11059d;
    delete_reopen_test();
LAB_0011059d:
    pfStack_10608 = (fdb_config *)0x1105a2;
    delete_reopen_test();
LAB_001105a2:
    pfStack_10608 = (fdb_config *)0x1105a7;
    delete_reopen_test();
LAB_001105a7:
    pfStack_10608 = (fdb_config *)0x1105ac;
    delete_reopen_test();
LAB_001105ac:
    pfStack_10608 = (fdb_config *)0x1105b1;
    delete_reopen_test();
LAB_001105b1:
    pfStack_10608 = (fdb_config *)0x1105b6;
    delete_reopen_test();
LAB_001105b6:
    pfStack_10608 = (fdb_config *)0x1105bb;
    delete_reopen_test();
LAB_001105bb:
    pfStack_10608 = (fdb_config *)0x1105c0;
    delete_reopen_test();
LAB_001105c0:
    pfStack_10608 = (fdb_config *)0x1105c5;
    delete_reopen_test();
LAB_001105c5:
    pfStack_10608 = (fdb_config *)0x1105ca;
    delete_reopen_test();
LAB_001105ca:
    pfStack_10608 = (fdb_config *)0x1105cf;
    delete_reopen_test();
LAB_001105cf:
    pfStack_10608 = (fdb_config *)0x1105d4;
    delete_reopen_test();
  }
  pfStack_10608 = (fdb_config *)deleted_doc_get_api_test;
  delete_reopen_test();
  pfStack_109b0 = (fdb_config *)0x1105f2;
  pfStack_10610 = &fStack_105c8;
  pfStack_10608 = (fdb_config *)pcVar7;
  gettimeofday(&tStack_10918,(__timezone_ptr_t)0x0);
  pfStack_109b0 = (fdb_config *)0x1105f7;
  memleak_start();
  pfStack_109b0 = (fdb_config *)0x110603;
  system("rm -rf  dummy* > errorlog.txt");
  uStack_10940 = 0;
  auStack_10988._0_8_ = 0;
  auStack_10988._8_8_ = 0;
  auStack_10988._16_8_ = 0;
  auStack_10988._24_8_ = 0;
  uStack_10958 = 0;
  pvStack_10950 = (void *)0x0;
  auStack_10988._32_8_ = auStack_10908;
  pfStack_10948 = &fStack_10808;
  fStack_10960 = 0xffffffffffffffff;
  pfVar5 = &fStack_10708;
  pfStack_109b0 = (fdb_config *)0x110652;
  fdb_get_default_config();
  fStack_10708.purging_interval = 1;
  fStack_10708.seqtree_opt = '\x01';
  pfStack_109b0 = (fdb_config *)0x110667;
  fdb_get_default_kvs_config();
  pfStack_109b0 = (fdb_config *)0x11067b;
  fVar2 = fdb_open(&pfStack_10990,"./dummy1",pfVar5);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_109b0 = (fdb_config *)0x110699;
    fVar2 = fdb_kvs_open(pfStack_10990,&pfStack_10998,(char *)0x0,&fStack_10930);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c4;
    builtin_memcpy(auStack_10908,"key",4);
    pfVar5 = &fStack_10808;
    fStack_10808.chunksize = 0x6f62;
    fStack_10808._2_2_ = 0x7964;
    fStack_10808.blocksize._0_1_ = 0;
    pfStack_109b0 = (fdb_config *)0x1106c6;
    auStack_10988._0_8_ = strlen((char *)auStack_10908);
    pcVar7 = auStack_10988;
    pfStack_109b0 = (fdb_config *)0x1106d6;
    auStack_10988._16_8_ = strlen((char *)pfVar5);
    pfStack_109b0 = (fdb_config *)0x1106e7;
    fVar2 = fdb_set(pfStack_10998,(fdb_doc *)pcVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108c9;
    pfStack_109b0 = (fdb_config *)0x1106fe;
    fVar2 = fdb_commit(pfStack_10990,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108ce;
    pfStack_109b0 = (fdb_config *)0x110715;
    fVar2 = fdb_del(pfStack_10998,(fdb_doc *)auStack_10988);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d3;
    pfStack_109b0 = (fdb_config *)0x11072c;
    fVar2 = fdb_commit(pfStack_10990,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108d8;
    pfVar5 = (fdb_config *)&pfStack_109a0;
    pfStack_109b0 = (fdb_config *)0x11075e;
    fdb_doc_create((fdb_doc **)pfVar5,auStack_10908,auStack_10988._0_8_,(void *)0x0,0,(void *)0x0,0)
    ;
    pfStack_109b0 = (fdb_config *)0x11076b;
    fVar2 = fdb_get_metaonly(pfStack_10998,pfStack_109a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108dd;
    if (pfStack_109a0->deleted == false) {
      pfStack_109b0 = (fdb_config *)0x110788;
      deleted_doc_get_api_test();
    }
    pfStack_109a0->deleted = false;
    pfStack_109b0 = (fdb_config *)0x11079b;
    fVar2 = fdb_get_metaonly_byseq(pfStack_10998,pfStack_109a0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108e2;
    if (pfStack_109a0->deleted == false) {
      pfStack_109b0 = (fdb_config *)0x1107b8;
      deleted_doc_get_api_test();
    }
    pfStack_109a0->deleted = false;
    pfStack_109b0 = (fdb_config *)0x1107cb;
    fVar2 = fdb_get_byoffset(pfStack_10998,pfStack_109a0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108e7;
    if (pfStack_109a0->deleted == false) {
      pfStack_109b0 = (fdb_config *)0x1107e9;
      deleted_doc_get_api_test();
    }
    pfStack_109a0->deleted = false;
    pfStack_109b0 = (fdb_config *)0x1107fc;
    fVar2 = fdb_get(pfStack_10998,pfStack_109a0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108ec;
    if (pfStack_109a0->deleted == true) {
      pfStack_109b0 = (fdb_config *)0x11081a;
      deleted_doc_get_api_test();
    }
    pfStack_109a0->deleted = false;
    pfStack_109b0 = (fdb_config *)0x11082d;
    fVar2 = fdb_get_byseq(pfStack_10998,pfStack_109a0);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001108f1;
    if (pfStack_109a0->deleted == true) {
      pfStack_109b0 = (fdb_config *)0x11084b;
      deleted_doc_get_api_test();
    }
    pfStack_109b0 = (fdb_config *)0x110855;
    fdb_doc_free(pfStack_109a0);
    pfStack_109b0 = (fdb_config *)0x11085f;
    fVar2 = fdb_kvs_close(pfStack_10998);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_001108f6;
    pfStack_109b0 = (fdb_config *)0x110871;
    fVar2 = fdb_close(pfStack_10990);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_109b0 = (fdb_config *)0x11087e;
      fdb_shutdown();
      pfStack_109b0 = (fdb_config *)0x110883;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (deleted_doc_get_api_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_109b0 = (fdb_config *)0x1108b4;
      fprintf(_stderr,pcVar7,"deleted doc get api test");
      return;
    }
  }
  else {
    pfStack_109b0 = (fdb_config *)0x1108c4;
    deleted_doc_get_api_test();
LAB_001108c4:
    pfStack_109b0 = (fdb_config *)0x1108c9;
    deleted_doc_get_api_test();
LAB_001108c9:
    pfStack_109b0 = (fdb_config *)0x1108ce;
    deleted_doc_get_api_test();
LAB_001108ce:
    pfStack_109b0 = (fdb_config *)0x1108d3;
    deleted_doc_get_api_test();
LAB_001108d3:
    pfStack_109b0 = (fdb_config *)0x1108d8;
    deleted_doc_get_api_test();
LAB_001108d8:
    pfStack_109b0 = (fdb_config *)0x1108dd;
    deleted_doc_get_api_test();
LAB_001108dd:
    pfStack_109b0 = (fdb_config *)0x1108e2;
    deleted_doc_get_api_test();
LAB_001108e2:
    pfStack_109b0 = (fdb_config *)0x1108e7;
    deleted_doc_get_api_test();
LAB_001108e7:
    pfStack_109b0 = (fdb_config *)0x1108ec;
    deleted_doc_get_api_test();
LAB_001108ec:
    pfStack_109b0 = (fdb_config *)0x1108f1;
    deleted_doc_get_api_test();
LAB_001108f1:
    pfStack_109b0 = (fdb_config *)0x1108f6;
    deleted_doc_get_api_test();
LAB_001108f6:
    pfStack_109b0 = (fdb_config *)0x1108fb;
    deleted_doc_get_api_test();
  }
  pfStack_109b0 = (fdb_config *)deleted_doc_stat_test;
  deleted_doc_get_api_test();
  pcStack_10d98 = (code *)0x110919;
  pfStack_109b8 = pfVar5;
  pfStack_109b0 = (fdb_config *)pcVar7;
  gettimeofday(&tStack_10d08,(__timezone_ptr_t)0x0);
  pcStack_10d98 = (code *)0x11091e;
  memleak_start();
  pcStack_10d98 = (code *)0x11092a;
  system("rm -rf  dummy* > errorlog.txt");
  uStack_10d28 = 0;
  auStack_10d70._0_8_ = 0;
  auStack_10d70._8_8_ = 0;
  auStack_10d70._16_8_ = 0;
  auStack_10d70._24_8_ = 0;
  uStack_10d40 = 0;
  pvStack_10d38 = (void *)0x0;
  auStack_10d70._32_8_ = acStack_10bb0;
  pfStack_10d30 = &fStack_10cb0;
  fStack_10d48 = 0xffffffffffffffff;
  pfVar5 = &fStack_10ab0;
  pcStack_10d98 = (code *)0x110979;
  fdb_get_default_config();
  fStack_10ab0.purging_interval = 0;
  pcStack_10d98 = (code *)0x11098a;
  fdb_get_default_kvs_config();
  pcStack_10d98 = (code *)0x11099e;
  fVar2 = fdb_open(&pfStack_10d88,"./dummy1",pfVar5);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_10d98 = (code *)0x1109c1;
    fVar2 = fdb_kvs_open(pfStack_10d88,&pfStack_10d80,"main",&fStack_10d20);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b41;
    acStack_10bb0[0] = 'K';
    acStack_10bb0[1] = '\0';
    pfVar5 = &fStack_10cb0;
    fStack_10cb0.chunksize = 0x6f62;
    fStack_10cb0._2_2_ = 0x7964;
    fStack_10cb0.blocksize._0_1_ = 0;
    pcStack_10d98 = (code *)0x1109ed;
    sVar3 = strlen(acStack_10bb0);
    auStack_10d70._0_8_ = sVar3 + 1;
    pcVar7 = auStack_10d70;
    pcStack_10d98 = (code *)0x110a00;
    sVar3 = strlen((char *)pfVar5);
    auStack_10d70._16_8_ = sVar3 + 1;
    pcStack_10d98 = (code *)0x110a14;
    fVar2 = fdb_set(pfStack_10d80,(fdb_doc *)pcVar7);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b46;
    pcStack_10d98 = (code *)0x110a2b;
    fVar2 = fdb_del(pfStack_10d80,(fdb_doc *)auStack_10d70);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b4b;
    pfVar5 = (fdb_config *)&pfStack_10d78;
    pcStack_10d98 = (code *)0x110a5a;
    fdb_doc_create((fdb_doc **)pfVar5,(void *)auStack_10d70._32_8_,auStack_10d70._0_8_,(void *)0x0,0
                   ,(void *)0x0,0);
    pcStack_10d98 = (code *)0x110a67;
    fVar2 = fdb_get(pfStack_10d80,pfStack_10d78);
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00110b50;
    pcStack_10d98 = (code *)0x110a7a;
    fdb_doc_free(pfStack_10d78);
    pcStack_10d98 = (code *)0x110a8c;
    fdb_get_file_info(pfStack_10d88,(fdb_file_info *)auStack_10cf8);
    pfVar5 = (fdb_config *)(auStack_10cf8 + 0x10);
    if (auStack_10cf8._16_8_ != 0) {
      pcStack_10d98 = (code *)0x110aa2;
      deleted_doc_stat_test();
    }
    pcStack_10d98 = (code *)0x110aae;
    fVar2 = fdb_commit(pfStack_10d88,'\0');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b55;
    pcVar7 = auStack_10cf8;
    pcStack_10d98 = (code *)0x110acb;
    fdb_get_file_info(pfStack_10d88,(fdb_file_info *)pcVar7);
    if (auStack_10cf8._16_8_ != 0) {
      pcStack_10d98 = (code *)0x110ada;
      deleted_doc_stat_test();
    }
    pcStack_10d98 = (code *)0x110ae4;
    fVar2 = fdb_kvs_close(pfStack_10d80);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110b5a;
    pcStack_10d98 = (code *)0x110af2;
    fVar2 = fdb_close(pfStack_10d88);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_10d98 = (code *)0x110afb;
      fdb_shutdown();
      pcStack_10d98 = (code *)0x110b00;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (deleted_doc_stat_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pcStack_10d98 = (code *)0x110b31;
      fprintf(_stderr,pcVar7,"deleted doc stat test");
      return;
    }
  }
  else {
    pcStack_10d98 = (code *)0x110b41;
    deleted_doc_stat_test();
LAB_00110b41:
    pcStack_10d98 = (code *)0x110b46;
    deleted_doc_stat_test();
LAB_00110b46:
    pcStack_10d98 = (code *)0x110b4b;
    deleted_doc_stat_test();
LAB_00110b4b:
    pcStack_10d98 = (code *)0x110b50;
    deleted_doc_stat_test();
LAB_00110b50:
    pcStack_10d98 = (code *)0x110b55;
    deleted_doc_stat_test();
LAB_00110b55:
    pcStack_10d98 = (code *)0x110b5a;
    deleted_doc_stat_test();
LAB_00110b5a:
    pcStack_10d98 = (code *)0x110b5f;
    deleted_doc_stat_test();
  }
  pcStack_10d98 = complete_delete_test;
  deleted_doc_stat_test();
  pcStack_11220 = (code *)0x110b81;
  pfStack_10dc0 = pfVar5;
  pfStack_10db8 = unaff_R12;
  pfStack_10db0 = unaff_R13;
  pfStack_10da8 = (fdb_config *)pcVar7;
  ppfStack_10da0 = unaff_R15;
  pcStack_10d98 = (code *)unaff_RBP;
  gettimeofday(&tStack_111f0,(__timezone_ptr_t)0x0);
  pcStack_11220 = (code *)0x110b86;
  memleak_start();
  pcVar7 = acStack_10ec8;
  builtin_strncpy(acStack_10ec8,"./dummy1",9);
  pcStack_11220 = (code *)0x110bab;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar5 = &fStack_10fc0;
  pcStack_11220 = (code *)0x110bbb;
  fdb_get_default_config();
  fStack_10fc0.buffercache_size = 0;
  kvs_config_00 = &fStack_111e0.create_if_missing;
  pcStack_11220 = (code *)0x110bd0;
  fdb_get_default_kvs_config();
  ptr_fhandle = &pfStack_11200;
  pcStack_11220 = (code *)0x110be3;
  fdb_open(ptr_fhandle,pcVar7,pfVar5);
  pcStack_11220 = (code *)0x110bfb;
  fVar2 = fdb_kvs_open(pfStack_11200,&pfStack_11208,"db1",(fdb_kvs_config *)kvs_config_00);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d95;
  unaff_RBP = 0;
  do {
    pcStack_11220 = (code *)0x110c2c;
    sprintf((char *)&fStack_110c8,"key%05d",unaff_RBP);
    pcStack_11220 = (code *)0x110c3b;
    sprintf((char *)apfStack_111c8,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_11208;
    pcStack_11220 = (code *)0x110c48;
    sVar3 = strlen((char *)&fStack_110c8);
    pcVar7 = (char *)(sVar3 + 1);
    pcStack_11220 = (code *)0x110c54;
    sVar3 = strlen((char *)apfStack_111c8);
    pcStack_11220 = (code *)0x110c69;
    fVar2 = fdb_set_kv(unaff_R13,&fStack_110c8,(size_t)pcVar7,apfStack_111c8,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_11220 = (code *)0x110d90;
      complete_delete_test();
      goto LAB_00110d90;
    }
    uVar6 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar6;
  } while (uVar6 != 1000);
  pcStack_11220 = (code *)0x110c8a;
  fdb_commit(pfStack_11200,'\x01');
  pcVar7 = "key%05d";
  pfVar5 = &fStack_110c8;
  kvs_config_00 = "value%05d";
  ptr_fhandle = apfStack_111c8;
  unaff_RBP = 0;
  do {
    pcStack_11220 = (code *)0x110cb6;
    sprintf((char *)pfVar5,"key%05d",unaff_RBP);
    pcStack_11220 = (code *)0x110cc5;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    unaff_R13 = pfStack_11208;
    pcStack_11220 = (code *)0x110cd2;
    sVar3 = strlen((char *)pfVar5);
    pcStack_11220 = (code *)0x110ce1;
    fVar2 = fdb_del_kv(unaff_R13,pfVar5,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d90;
    uVar6 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar6;
  } while (uVar6 != 1000);
  pcStack_11220 = (code *)0x110d02;
  fdb_commit(pfStack_11200,'\x01');
  pcStack_11220 = (code *)0x110d22;
  fVar2 = fdb_iterator_init(pfStack_11208,&pfStack_111f8,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d9a;
  pcStack_11220 = (code *)0x110d30;
  fVar2 = fdb_iterator_close(pfStack_111f8);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_11220 = (code *)0x110d3e;
    fdb_close(pfStack_11200);
    pcStack_11220 = (code *)0x110d43;
    fdb_shutdown();
    pcStack_11220 = (code *)0x110d48;
    memleak_end();
    pcVar7 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar7 = "%s FAILED\n";
    }
    pcStack_11220 = (code *)0x110d79;
    fprintf(_stderr,pcVar7,"complete delete");
    return;
  }
  goto LAB_00110d9f;
LAB_00110d90:
  pfVar5 = &fStack_110c8;
  ptr_fhandle = apfStack_111c8;
  kvs_config_00 = "value%05d";
  pcStack_11220 = (code *)0x110d95;
  complete_delete_test();
LAB_00110d95:
  pcStack_11220 = (code *)0x110d9a;
  complete_delete_test();
LAB_00110d9a:
  pcStack_11220 = (code *)0x110d9f;
  complete_delete_test();
LAB_00110d9f:
  pcStack_11220 = large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_11698 = (fdb_config *)0x110dc1;
  pcStack_11248 = pcVar7;
  ppfStack_11240 = ptr_fhandle;
  pfStack_11238 = unaff_R13;
  pfStack_11230 = pfVar5;
  pfStack_11228 = (fdb_kvs_config *)kvs_config_00;
  pcStack_11220 = (code *)unaff_RBP;
  gettimeofday(&tStack_11660,(__timezone_ptr_t)0x0);
  pfStack_11698 = (fdb_config *)0x110dc6;
  memleak_start();
  pfStack_11698 = (fdb_config *)0x110dd0;
  __ptr = (fdb_config *)malloc(4000000);
  pfStack_11698 = (fdb_config *)0x110ddf;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar5 = &fStack_11548;
  pfStack_11698 = (fdb_config *)0x110def;
  fdb_get_default_config();
  pfStack_11698 = (fdb_config *)0x110df9;
  fdb_get_default_kvs_config();
  pfStack_11698 = (fdb_config *)0x110e0d;
  fVar2 = fdb_open(&pfStack_11688,"./dummy1",pfVar5);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_11698 = (fdb_config *)0x110e2b;
    fVar2 = fdb_kvs_open(pfStack_11688,&pfStack_11680,(char *)0x0,&fStack_11678);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb0;
    pcVar7 = (char *)0x0;
    uVar8 = 0;
    do {
      pfStack_11698 = (fdb_config *)0x110e54;
      sprintf(acStack_11350,"key%128d",uVar8 & 0xffffffff);
      pfStack_11698 = (fdb_config *)0x110e70;
      sprintf(acStack_11450,"meta%128d",uVar8 & 0xffffffff);
      pfStack_11698 = (fdb_config *)0x110e86;
      sprintf(acStack_11650,"body%128d",uVar8 & 0xffffffff);
      pfStack_11698 = (fdb_config *)0x110e92;
      sVar3 = strlen(acStack_11350);
      pfStack_11698 = (fdb_config *)0x110ea0;
      metalen = strlen(acStack_11450);
      pfStack_11698 = (fdb_config *)0x110ead;
      bodylen = strlen(acStack_11650);
      pfStack_11698 = (fdb_config *)0x110ed7;
      fdb_doc_create((fdb_doc **)(pcVar7 + (long)&__ptr->chunksize),acStack_11350,sVar3,
                     acStack_11450,metalen,acStack_11650,bodylen);
      pfStack_11698 = (fdb_config *)0x110ee5;
      fdb_set(pfStack_11680,*(fdb_doc **)(&__ptr->chunksize + uVar8 * 4));
      pfStack_11698 = (fdb_config *)0x110eee;
      fdb_doc_free(*(fdb_doc **)(&__ptr->chunksize + uVar8 * 4));
      uVar8 = uVar8 + 1;
      pcVar7 = pcVar7 + 8;
    } while (uVar8 != 500000);
    pfStack_11698 = (fdb_config *)0x110f0c;
    fVar2 = fdb_kvs_close(pfStack_11680);
    pfVar5 = __ptr;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb5;
    pfStack_11698 = (fdb_config *)0x110f1e;
    fVar2 = fdb_close(pfStack_11688);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fba;
    pfStack_11698 = (fdb_config *)0x110f3f;
    fVar2 = fdb_open(&pfStack_11688,"./dummy1",&fStack_11548);
    if (fVar2 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f56:
      pfStack_11698 = (fdb_config *)0x110f5e;
      free(__ptr);
      pfStack_11698 = (fdb_config *)0x110f63;
      fdb_shutdown();
      pfStack_11698 = (fdb_config *)0x110f68;
      memleak_end();
      pcVar7 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar7 = "%s FAILED\n";
      }
      pfStack_11698 = (fdb_config *)0x110f99;
      fprintf(_stderr,pcVar7,"large batch write test with no commits");
      return;
    }
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_11698 = (fdb_config *)0x110f52;
      fVar2 = fdb_close(pfStack_11688);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00110f56;
      goto LAB_00110fc4;
    }
  }
  else {
    pfStack_11698 = (fdb_config *)0x110fb0;
    large_batch_write_no_commit_test();
LAB_00110fb0:
    pfStack_11698 = (fdb_config *)0x110fb5;
    large_batch_write_no_commit_test();
LAB_00110fb5:
    pfStack_11698 = (fdb_config *)0x110fba;
    large_batch_write_no_commit_test();
LAB_00110fba:
    pfStack_11698 = (fdb_config *)0x110fbf;
    large_batch_write_no_commit_test();
  }
  pfStack_11698 = (fdb_config *)0x110fc4;
  large_batch_write_no_commit_test();
LAB_00110fc4:
  pfStack_11698 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_116a8 = pcVar7;
  pfStack_116a0 = pfVar5;
  pfStack_11698 = __ptr;
  gettimeofday(&tStack_118c8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_118a0.wal_threshold = 0x400;
  fStack_118a0.seqtree_opt = '\x01';
  fStack_118a0.purging_interval = 1;
  fStack_118a0.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_118d0,"./dummy1",&fStack_118a0);
  fdb_kvs_open(pfStack_118d0,&pfStack_118d8,"db1",&fStack_118b8);
  sprintf(acStack_117a8,"key%d",0);
  sVar3 = strlen(acStack_117a8);
  fdb_doc_create(&pfStack_118e0,acStack_117a8,sVar3,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_118d8,pfStack_118e0);
  fVar2 = fdb_get(pfStack_118d8,pfStack_118e0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar2 = fdb_get_byoffset(pfStack_118d8,pfStack_118e0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_metaonly(pfStack_118d8,pfStack_118e0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_metaonly_byseq(pfStack_118d8,pfStack_118e0);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_118d8,pfStack_118e0);
        fVar2 = fdb_get(pfStack_118d8,pfStack_118e0);
        if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_118e0->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly(pfStack_118d8,pfStack_118e0);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            if (pfStack_118e0->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar2 = fdb_get_metaonly_byseq(pfStack_118d8,pfStack_118e0);
            if (fVar2 == FDB_RESULT_SUCCESS) {
              if (pfStack_118e0->deleted != false) {
                fVar2 = fdb_get_byoffset(pfStack_118d8,pfStack_118e0);
                if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_118e0->deleted != false) {
                    fdb_doc_free(pfStack_118e0);
                    fdb_kvs_close(pfStack_118d8);
                    fdb_close(pfStack_118d0);
                    fdb_shutdown();
                    memleak_end();
                    pcVar7 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar7 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar7,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void init_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();

    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    status = fdb_init(&fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT("init test");
}